

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void LDSketch_update(LDSketch_t *sk,uchar *key,longlong val)

{
  long in_RDI;
  int k;
  int j;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  uchar *in_stack_00000048;
  LDSketch_t *in_stack_00000050;
  int in_stack_00000084;
  uchar *in_stack_00000088;
  dyn_tbl_t *in_stack_00000090;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
    LDSketch_find(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                  in_stack_0000003c);
    dyn_tbl_update(in_stack_00000090,in_stack_00000088,in_stack_00000084);
  }
  return;
}

Assistant:

void LDSketch_update(LDSketch_t* sk, unsigned char* key, long long val) {
	int j, k;

	// mangle
	// mangle(key, key_to_add, tbl->n/8);

	// add key/val to table
	for (j = 0; j < sk->h; ++j) {
		k = LDSketch_find(sk, key, 0, sk->lgn - 1, j);
		// tbl->T[j*tbl->w+k] += val;
		dyn_tbl_update(sk->tbl[j * sk->w + k], key, val);
	}
	// tbl->total += val;
}